

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_lv_base.h
# Opt level: O0

sc_lv_base * __thiscall sc_dt::sc_lv_base::operator=(sc_lv_base *this,sc_logic *a)

{
  sc_lv_base *in_RDI;
  
  sc_proxy<sc_dt::sc_lv_base>::assign_(&this->super_sc_proxy<sc_dt::sc_lv_base>,a);
  return in_RDI;
}

Assistant:

sc_lv_base& operator = ( const sc_unsigned& a )
	{ base_type::assign_( a ); return *this; }